

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseEnergyOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *s1;
  string *s1_00;
  ValueOption option;
  bool bVar1;
  int value_00;
  InputError *pIVar2;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  double local_38;
  double value;
  
  s1_00 = (tokenList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (0x40 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)s1_00)) {
    std::__cxx11::string::string((string *)&local_58,"GLOBAL",(allocator *)((long)&value + 7));
    bVar1 = Utilities::match(s1_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"PRICE",(allocator *)((long)&value + 7));
      s1 = s1_00 + 1;
      bVar1 = Utilities::match(s1,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        bVar1 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
        if (!bVar1) {
          pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_118,(string *)(s1_00 + 2));
          InputError::InputError(pIVar2,6,&local_118);
          __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
        }
        option = ENERGY_PRICE;
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"PATTERN",(allocator *)((long)&value + 7));
        bVar1 = Utilities::match(s1,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (bVar1) {
          value_00 = Network::indexOf(network,PATTERN,s1_00 + 2);
          if (-1 < value_00) {
            Options::setOption(&network->options,ENERGY_PRICE_PATTERN,value_00);
            return;
          }
          pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_f8,(string *)(s1_00 + 2));
          InputError::InputError(pIVar2,5,&local_f8);
          __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
        }
        std::__cxx11::string::string((string *)&local_58,"EFFIC",(allocator *)((long)&value + 7));
        bVar1 = Utilities::match(s1,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar1) {
          pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_b8,(string *)s1);
          InputError::InputError(pIVar2,3,&local_b8);
          __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
        }
        bVar1 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
        if (!bVar1) {
          pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_d8,(string *)(s1_00 + 2));
          InputError::InputError(pIVar2,6,&local_d8);
          __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
        }
        option = PUMP_EFFICIENCY;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_58,"DEMAND",(allocator *)((long)&value + 7));
      bVar1 = Utilities::match(s1_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar1) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_78,(string *)s1_00);
        InputError::InputError(pIVar2,3,&local_78);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar1 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
      if (!bVar1) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_98,(string *)(s1_00 + 2));
        InputError::InputError(pIVar2,6,&local_98);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      option = PEAKING_CHARGE;
    }
    Options::setOption(&network->options,option,local_38);
  }
  return;
}

Assistant:

void OptionParser::parseEnergyOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) return;
    string* tokens = &tokenList[0];
    double value;

    // ... check for global energy options

    if (Utilities::match(tokens[0], w_GLOBAL))
    {
        // ... global price per kwh

        if (Utilities::match(tokens[1], w_PRICE))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::ENERGY_PRICE, value);
        }

        // ... global time of day price pattern

        else if (Utilities::match(tokens[1], w_PATTERN))
        {
            int j = network->indexOf(Element::PATTERN, tokens[2]);
            if (j < 0) throw InputError(InputError::UNDEFINED_OBJECT, tokens[2]);
            network->options.setOption(Options::ENERGY_PRICE_PATTERN, j);
        }

        // ... global pump efficiency

        else if (Utilities::match(tokens[1], w_EFFIC))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::PUMP_EFFICIENCY, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... peak demand charge

    else if (Utilities::match(tokens[0], w_DEMAND))
    {
        if ( !Utilities::parseNumber(tokens[2], value) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
        network->options.setOption(Options::PEAKING_CHARGE, value);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}